

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

int uv__udp_set_membership6
              (uv_udp_t *handle,sockaddr_in6 *multicast_addr,char *interface_addr,
              uv_membership membership)

{
  int iVar1;
  int *piVar2;
  undefined1 local_64 [8];
  sockaddr_in6 addr6;
  ipv6_mreq mreq;
  int optname;
  uv_membership membership_local;
  char *interface_addr_local;
  sockaddr_in6 *multicast_addr_local;
  uv_udp_t *handle_local;
  
  memset((void *)((long)&addr6.sin6_addr.__in6_u + 0xc),0,0x14);
  if ((interface_addr == (char *)0x0) ||
     (iVar1 = uv_ip6_addr(interface_addr,0,(sockaddr_in6 *)local_64), iVar1 == 0)) {
    addr6._20_8_ = *(undefined8 *)&(multicast_addr->sin6_addr).__in6_u;
    if (membership == UV_LEAVE_GROUP) {
      mreq.ipv6mr_interface = 0x15;
    }
    else {
      if (membership != UV_JOIN_GROUP) {
        return -0x16;
      }
      mreq.ipv6mr_interface = 0x14;
    }
    iVar1 = setsockopt((handle->io_watcher).fd,0x29,mreq.ipv6mr_interface,
                       (void *)((long)&addr6.sin6_addr.__in6_u + 0xc),0x14);
    if (iVar1 == 0) {
      handle_local._4_4_ = 0;
    }
    else {
      piVar2 = __errno_location();
      handle_local._4_4_ = -*piVar2;
    }
  }
  else {
    handle_local._4_4_ = -0x16;
  }
  return handle_local._4_4_;
}

Assistant:

static int uv__udp_set_membership6(uv_udp_t* handle,
                                   const struct sockaddr_in6* multicast_addr,
                                   const char* interface_addr,
                                   uv_membership membership) {
  int optname;
  struct ipv6_mreq mreq;
  struct sockaddr_in6 addr6;

  memset(&mreq, 0, sizeof mreq);

  if (interface_addr) {
    if (uv_ip6_addr(interface_addr, 0, &addr6))
      return UV_EINVAL;
    mreq.ipv6mr_interface = addr6.sin6_scope_id;
  } else {
    mreq.ipv6mr_interface = 0;
  }

  mreq.ipv6mr_multiaddr = multicast_addr->sin6_addr;

  switch (membership) {
  case UV_JOIN_GROUP:
    optname = IPV6_ADD_MEMBERSHIP;
    break;
  case UV_LEAVE_GROUP:
    optname = IPV6_DROP_MEMBERSHIP;
    break;
  default:
    return UV_EINVAL;
  }

  if (setsockopt(handle->io_watcher.fd,
                 IPPROTO_IPV6,
                 optname,
                 &mreq,
                 sizeof(mreq))) {
#if defined(__MVS__)
  if (errno == ENXIO)
    return UV_ENODEV;
#endif
    return UV__ERR(errno);
  }

  return 0;
}